

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

string * __thiscall
xla::GraphCycles::Path_abi_cxx11_
          (string *__return_storage_ptr__,GraphCycles *this,int x,int y,int max_path_len)

{
  uint uVar1;
  ulong uVar2;
  char buf [20];
  int32_t path [20];
  char acStack_a8 [32];
  uint local_88 [22];
  
  if (Path[abi:cxx11](int,int,int)::kPathSize == '\0') {
    Path_abi_cxx11_((GraphCycles *)(ulong)(uint)max_path_len);
  }
  uVar1 = FindPath(this,x,y,Path::kPathSize,(int32_t *)local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if ((long)Path::kPathSize <= (long)uVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      snprintf(acStack_a8,0x14,"%d",(ulong)local_88[uVar2]);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GraphCycles::Path(int x, int y, const int max_path_len) {
  static const int kPathSize = max_path_len;
  int32_t path[max_path_len_20];
  int np = FindPath(x, y, kPathSize, path);
  std::string result;
  for (int i = 0; i < np; i++) {
      if (i >= kPathSize) {
          result += " ...";
          break;
      }
      if (!result.empty())
          result.push_back(' ');
      char buf[20];
      snprintf(buf, sizeof(buf), "%d", path[i]);
      result += buf;
  }
  return result;
}